

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86PUSH(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uchar *puVar1;
  uint uVar2;
  x86Reg index_00;
  byte bVar3;
  
  if (1 < size - sDWORD) {
    __assert_fail("size == sDWORD || size == sQWORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x2bf,"int x86PUSH(unsigned char *, x86Size, x86Reg, int, x86Reg, int)");
  }
  index_00 = index;
  if ((multiplier == 1 && base == rNONE) && index != rNONE) {
    index_00 = rNONE;
    base = index;
  }
  bVar3 = 8 < (int)base | (8 < (int)index_00) * '\x02';
  if (bVar3 != 0) {
    *stream = bVar3 | 0x40;
  }
  puVar1 = stream + (bVar3 != 0);
  *puVar1 = 0xff;
  uVar2 = encodeAddress(puVar1 + 1,index_00,multiplier,base,shift,6);
  return (uVar2 + (int)(puVar1 + 1)) - (int)stream;
}

Assistant:

int x86PUSH(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);
	(void)size;

	if(base == rNONE && index != rNONE && multiplier == 1)	// swap so if there is only one register, it will be base
	{
		base = index;
		index = rNONE;
	}

	stream += encodeRex(stream, false, rNONE, index, base);
	*stream++ = 0xff;
	stream += encodeAddress(stream, index, multiplier, base, shift, 6);

	return int(stream - start);
}